

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_converter.cpp
# Opt level: O2

unsafe_unique_array<char> __thiscall duckdb::AddName(duckdb *this,string *name)

{
  size_t i;
  ulong uVar1;
  
  make_unsafe_uniq_array<char>(this,name->_M_string_length + 1);
  for (uVar1 = 0; uVar1 < name->_M_string_length; uVar1 = uVar1 + 1) {
    *(char *)(*(long *)this + uVar1) = (name->_M_dataplus)._M_p[uVar1];
  }
  *(undefined1 *)(*(long *)this + name->_M_string_length) = 0;
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)this;
}

Assistant:

unsafe_unique_array<char> AddName(const string &name) {
	auto name_ptr = make_unsafe_uniq_array<char>(name.size() + 1);
	for (size_t i = 0; i < name.size(); i++) {
		name_ptr[i] = name[i];
	}
	name_ptr[name.size()] = '\0';
	return name_ptr;
}